

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ClearField(Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *pRVar1;
  undefined8 uVar2;
  FieldDescriptor FVar3;
  string *default_value;
  long *plVar4;
  bool bVar5;
  CppType CVar6;
  uint32 uVar7;
  EnumValueDescriptor *pEVar8;
  undefined8 *puVar9;
  ulong uVar10;
  Arena *arena;
  void *extraout_RDX;
  RepeatedPtrFieldBase *this_00;
  undefined4 uVar11;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    internal::ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite +
               (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44));
    return;
  }
  if (*(int *)(field + 0x3c) == 3) {
    CVar6 = FieldDescriptor::cpp_type(field);
    switch(CVar6) {
    case CPPTYPE_INT32:
    case CPPTYPE_INT64:
    case CPPTYPE_UINT32:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_BOOL:
    case CPPTYPE_ENUM:
      uVar7 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = 0;
      return;
    case CPPTYPE_STRING:
      uVar7 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      internal::RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7));
      return;
    case CPPTYPE_MESSAGE:
      goto switchD_0026aee3_caseD_a;
    default:
      return;
    }
  }
  if (*(long *)(field + 0x58) != 0) {
    ClearOneofField(this,message,field);
    return;
  }
  bVar5 = HasBit(this,message,field);
  if (!bVar5) {
    return;
  }
  ClearBit(this,message,field);
  CVar6 = FieldDescriptor::cpp_type(field);
  switch(CVar6) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    uVar11 = *(undefined4 *)(field + 0x90);
    goto LAB_0026b07d;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    uVar2 = *(undefined8 *)(field + 0x90);
    uVar7 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = uVar2;
    break;
  case CPPTYPE_DOUBLE:
    uVar2 = *(undefined8 *)(field + 0x90);
    uVar7 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = uVar2;
    break;
  case CPPTYPE_FLOAT:
    uVar11 = *(undefined4 *)(field + 0x90);
    uVar7 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = uVar11;
    break;
  case CPPTYPE_BOOL:
    FVar3 = field[0x90];
    uVar7 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(FieldDescriptor *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) =
         FVar3;
    break;
  case CPPTYPE_ENUM:
    pEVar8 = FieldDescriptor::default_value_enum(field);
    uVar11 = *(undefined4 *)(pEVar8 + 0x10);
LAB_0026b07d:
    uVar7 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = uVar11;
    break;
  case CPPTYPE_STRING:
    pRVar1 = &this->schema_;
    bVar5 = internal::ReflectionSchema::IsFieldInlined(pRVar1,field);
    if (bVar5) {
      internal::ReflectionSchema::GetFieldDefault(pRVar1,field);
      uVar7 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      std::__cxx11::string::_M_assign
                ((string *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7));
      return;
    }
    puVar9 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(pRVar1,field);
    default_value = (string *)*puVar9;
    uVar7 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
    arena = *(Arena **)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).metadata_offset_);
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::SetAllocated
              ((ArenaStringPtr *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7),default_value,
               (string *)0x0,arena);
    return;
  case CPPTYPE_MESSAGE:
    pRVar1 = &this->schema_;
    if ((this->schema_).has_bits_offset_ != -1) {
      uVar7 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      (**(code **)(**(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7)
                  + 0x38))();
      return;
    }
    uVar10 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar10 & 1) != 0) {
      uVar10 = *(ulong *)((uVar10 & 0xfffffffffffffffe) + 0x18);
    }
    if (uVar10 == 0) {
      uVar7 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
      plVar4 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
    }
    uVar7 = internal::ReflectionSchema::GetFieldOffset(pRVar1,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7) = 0;
  }
  return;
switchD_0026aee3_caseD_a:
  bVar5 = FieldDescriptor::is_map(field);
  uVar7 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (RepeatedPtrFieldBase *)
            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7);
  if (bVar5) {
    (*this_00->arena_->on_arena_allocation_)((type_info *)this_00,(uint64)field,extraout_RDX);
    return;
  }
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(this_00);
  return;
}

Assistant:

void Reflection::ClearField(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (field->containing_oneof()) {
      ClearOneofField(message, field);
      return;
    }
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
    *MutableRaw<TYPE>(message, field) = field->default_value_##TYPE(); \
    break;

        CLEAR_TYPE(INT32, int32);
        CLEAR_TYPE(INT64, int64);
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT, float);
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL, bool);
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
              field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              if (IsInlined(field)) {
                const std::string* default_ptr =
                    &DefaultRaw<InlinedStringField>(field).GetNoArena();
                MutableRaw<InlinedStringField>(message, field)
                    ->SetNoArena(default_ptr, *default_ptr);
                break;
              }

              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableRaw<ArenaStringPtr>(message, field)
                  ->SetAllocated(default_ptr, nullptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (!schema_.HasHasbits()) {
            // Proto3 does not have has-bits and we need to set a message field
            // to nullptr in order to indicate its un-presence.
            if (GetArena(message) == nullptr) {
              delete *MutableRaw<Message*>(message, field);
            }
            *MutableRaw<Message*>(message, field) = nullptr;
          } else {
            (*MutableRaw<Message*>(message, field))->Clear();
          }
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear(); \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)->Clear();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}